

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::insert
          (QMovableArrayOps<QTextLayout::FormatRange> *this,qsizetype i,qsizetype n,parameter_type t
          )

{
  FormatRange **ppFVar1;
  qsizetype *pqVar2;
  long in_FS_OFFSET;
  bool bVar3;
  Inserter local_70;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextLayout::FormatRange::FormatRange((FormatRange *)&local_48,t);
  bVar3 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
          super_QArrayDataPointer<QTextLayout::FormatRange>.size != 0;
  QArrayDataPointer<QTextLayout::FormatRange>::detachAndGrow
            ((QArrayDataPointer<QTextLayout::FormatRange> *)this,(uint)(i == 0 && bVar3),n,
             (FormatRange **)0x0,(QArrayDataPointer<QTextLayout::FormatRange> *)0x0);
  if (i == 0 && bVar3) {
    while (bVar3 = n != 0, n = n + -1, bVar3) {
      QTextLayout::FormatRange::FormatRange
                ((this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                 super_QArrayDataPointer<QTextLayout::FormatRange>.ptr + -1,(FormatRange *)&local_48
                );
      ppFVar1 = &(this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                 super_QArrayDataPointer<QTextLayout::FormatRange>.ptr;
      *ppFVar1 = *ppFVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                super_QArrayDataPointer<QTextLayout::FormatRange>.size;
      *pqVar2 = *pqVar2 + 1;
    }
  }
  else {
    Inserter::Inserter(&local_70,(QArrayDataPointer<QTextLayout::FormatRange> *)this,i,n);
    Inserter::insertFill(&local_70,(FormatRange *)&local_48,n);
    Inserter::~Inserter(&local_70);
  }
  QTextFormat::~QTextFormat((QTextFormat *)&puStack_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }